

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
::operator=(SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
            *this,SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
                  *RHS)

{
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
  *__first;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
  *pIVar1;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
  *E;
  ulong uVar2;
  ulong MinSize;
  ulong uVar3;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
  *__result;
  
  if (this == RHS) {
    return this;
  }
  __first = (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
             *)(RHS->
               super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
               ).
               super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
               .super_SmallVectorBase.BeginX;
  pIVar1 = (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
            *)(RHS->
              super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
              ).
              super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
              .super_SmallVectorBase.EndX;
  uVar3 = (long)pIVar1 - (long)__first;
  MinSize = ((long)uVar3 >> 3) * 0x4fa4fa4fa4fa4fa5;
  __result = (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
              *)(this->
                super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                ).
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                .super_SmallVectorBase.BeginX;
  E = (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
       *)(this->
         super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
         .super_SmallVectorBase.EndX;
  uVar2 = ((long)E - (long)__result >> 3) * 0x4fa4fa4fa4fa4fa5;
  if (MinSize <= uVar2) {
    if (pIVar1 != __first) {
      __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
                 __copy_m<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>const*,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>*>
                           (__first,(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                                     *)(uVar3 + (long)__first),__result);
      E = (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
           *)(this->
             super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
             .super_SmallVectorBase.EndX;
    }
    SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
    ::destroy_range(__result,E);
    goto LAB_00158a5f;
  }
  if ((ulong)((long)(this->
                    super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                    .super_SmallVectorBase.CapacityX - (long)__result) < uVar3) {
    SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
    ::destroy_range(__result,E);
    (this->
    super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
    .super_SmallVectorBase.EndX =
         (this->
         super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
         .super_SmallVectorBase.BeginX;
    SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
    ::grow(&this->
            super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
           ,MinSize);
LAB_00158a40:
    uVar2 = 0;
  }
  else {
    if (E == __result) goto LAB_00158a40;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>const*,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>*>
              (__first,(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                        *)(((long)E - (long)__result) + (long)__first),__result);
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>const*,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>*>
            ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
              *)((long)(RHS->
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                       ).
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                       .super_SmallVectorBase.BeginX + uVar2 * 0x168),
             (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
              *)(RHS->
                super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                ).
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                .super_SmallVectorBase.EndX,
             (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
              *)(uVar2 * 0x168 +
                (long)(this->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                      .super_SmallVectorBase.BeginX));
  __result = (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
              *)(uVar3 + (long)(this->
                               super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                               ).
                               super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                               .super_SmallVectorBase.BeginX);
LAB_00158a5f:
  (this->
  super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
  ).
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
  .super_SmallVectorBase.EndX = __result;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}